

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.cpp
# Opt level: O0

void __thiscall
phyr::PlasticMaterial::computeScatteringFunctions
          (PlasticMaterial *this,SurfaceInteraction *si,MemoryPool *pool,TransportMode mode,
          bool allowMultipleLobes)

{
  bool bVar1;
  CoefficientSpectrum<60> *this_00;
  element_type *peVar2;
  Spectrum *R;
  element_type *peVar3;
  Fresnel *fresnel_00;
  BxDF *b;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  MemoryPool *extraout_XMM0_Qa;
  MemoryPool *this_01;
  BxDF *spec;
  MicrofacetDistribution *distrib;
  double rough;
  Fresnel *fresnel;
  Spectrum ks;
  Spectrum kd;
  CoefficientSpectrum<60> *in_stack_fffffffffffff448;
  LambertianReflection *in_stack_fffffffffffff450;
  SurfaceInteraction *in_stack_fffffffffffff458;
  MicrofacetReflection *in_stack_fffffffffffff460;
  BxDF *in_stack_fffffffffffff468;
  size_t in_stack_fffffffffffff488;
  MemoryPool *in_stack_fffffffffffff490;
  undefined1 local_b60 [960];
  CoefficientSpectrum<60> local_7a0;
  undefined1 local_5c0 [960];
  CoefficientSpectrum<60> local_200;
  byte local_1d;
  long local_10;
  
  local_1d = in_R8B & 1;
  local_10 = in_RSI;
  this_00 = (CoefficientSpectrum<60> *)
            MemoryPool::alloc(in_stack_fffffffffffff490,in_stack_fffffffffffff488);
  BSDF::BSDF((BSDF *)in_stack_fffffffffffff460,in_stack_fffffffffffff458,
             (double)in_stack_fffffffffffff450);
  *(CoefficientSpectrum<60> **)(local_10 + 0xd0) = this_00;
  peVar2 = std::
           __shared_ptr_access<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x195fa0);
  (**peVar2->_vptr_Texture)(local_5c0,peVar2,local_10);
  CoefficientSpectrum<60>::clamp
            (this_00,(double)in_stack_fffffffffffff468,(double)in_stack_fffffffffffff460);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  bVar1 = CoefficientSpectrum<60>::isBlack(&local_200);
  if (!bVar1) {
    in_stack_fffffffffffff460 = *(MicrofacetReflection **)(local_10 + 0xd0);
    in_stack_fffffffffffff468 =
         (BxDF *)MemoryPool::alloc(in_stack_fffffffffffff490,in_stack_fffffffffffff488);
    LambertianReflection::LambertianReflection
              (in_stack_fffffffffffff450,(Spectrum *)in_stack_fffffffffffff448);
    BSDF::add((BSDF *)in_stack_fffffffffffff460,in_stack_fffffffffffff468);
  }
  peVar2 = std::
           __shared_ptr_access<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x196056);
  (**peVar2->_vptr_Texture)(local_b60,peVar2,local_10);
  CoefficientSpectrum<60>::clamp
            (this_00,(double)in_stack_fffffffffffff468,(double)in_stack_fffffffffffff460);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff450,in_stack_fffffffffffff448);
  bVar1 = CoefficientSpectrum<60>::isBlack(&local_7a0);
  if (!bVar1) {
    R = (Spectrum *)MemoryPool::alloc(in_stack_fffffffffffff490,in_stack_fffffffffffff488);
    FresnelDielectric::FresnelDielectric
              ((FresnelDielectric *)in_stack_fffffffffffff460,(double)R,
               (double)in_stack_fffffffffffff450);
    peVar3 = std::
             __shared_ptr_access<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1960f9);
    (**peVar3->_vptr_Texture)(peVar3,local_10);
    this_01 = extraout_XMM0_Qa;
    if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
      this_01 = (MemoryPool *)
                TrowbridgeReitzDistribution::roughnessToAlpha((double)in_stack_fffffffffffff450);
    }
    fresnel_00 = (Fresnel *)MemoryPool::alloc(this_01,in_stack_fffffffffffff488);
    TrowbridgeReitzDistribution::TrowbridgeReitzDistribution
              ((TrowbridgeReitzDistribution *)in_stack_fffffffffffff460,(double)R,
               (double)in_stack_fffffffffffff450,SUB81((ulong)fresnel_00 >> 0x38,0));
    b = (BxDF *)MemoryPool::alloc(this_01,(size_t)fresnel_00);
    MicrofacetReflection::MicrofacetReflection
              (in_stack_fffffffffffff460,R,(MicrofacetDistribution *)b,fresnel_00);
    BSDF::add(*(BSDF **)(local_10 + 0xd0),b);
  }
  return;
}

Assistant:

void PlasticMaterial::computeScatteringFunctions(SurfaceInteraction* si,
                                                 MemoryPool& pool, TransportMode mode,
                                                 bool allowMultipleLobes) const {
    si->bsdf = POOL_ALLOC(pool, BSDF)(*si);
    // Initialize diffuse component of plastic material
    Spectrum kd = Kd->evaluate(*si).clamp();
    if (!kd.isBlack())
        si->bsdf->add(POOL_ALLOC(pool, LambertianReflection)(kd));

    // Initialize specular component of plastic material
    Spectrum ks = Ks->evaluate(*si).clamp();
    if (!ks.isBlack()) {
        Fresnel* fresnel = POOL_ALLOC(pool, FresnelDielectric)(1.5f, 1.f);
        // Create microfacet distribution {distrib} for plastic material
        Real rough = roughness->evaluate(*si);
        if (remapRoughness)
            rough = TrowbridgeReitzDistribution::roughnessToAlpha(rough);
        MicrofacetDistribution *distrib =
            POOL_ALLOC(pool, TrowbridgeReitzDistribution)(rough, rough);
        BxDF* spec = POOL_ALLOC(pool, MicrofacetReflection)(ks, distrib, fresnel);
        si->bsdf->add(spec);
    }
}